

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O0

TValue * cploop_opt(lua_State *L,lua_CFunction dummy,void *ud)

{
  void *ud_local;
  lua_CFunction dummy_local;
  lua_State *L_local;
  
  loop_unroll((LoopState *)ud);
  return (TValue *)0x0;
}

Assistant:

static TValue *cploop_opt(lua_State *L, lua_CFunction dummy, void *ud)
{
  UNUSED(L); UNUSED(dummy);
  loop_unroll((LoopState *)ud);
  return NULL;
}